

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

bool ON_Mesh_Private_AddPerVertexMappingChannels
               (function<ON_TextureMapping_(const_ON_MappingChannel_*)> *get_texture_mapping_func,
               ON_MappingRef *mapping_ref,ON_SimpleArray<ON_TextureMapping::TYPE> *mappings_to_cache
               ,ON_Material *material,
               unordered_map<unsigned_int,_ON_TextureMapping,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_ON_TextureMapping>_>_>
               *mappings)

{
  ON_Texture *pOVar1;
  bool bVar2;
  iterator iVar3;
  ON_MappingChannel *pOVar4;
  long lVar5;
  int i;
  long lVar6;
  double dVar7;
  uint mapping_channel_id;
  undefined4 uStack_8c;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  function<ON_TextureMapping_(const_ON_MappingChannel_*)> *local_80;
  ON_SimpleArray<ON_TextureMapping::TYPE> *local_78;
  function<ON_TextureMapping_(const_ON_MappingChannel_*)> local_70;
  function<ON_TextureMapping_(const_ON_MappingChannel_*)> local_50;
  
  lVar5 = 0xe0;
  local_80 = get_texture_mapping_func;
  local_78 = mappings_to_cache;
  for (lVar6 = 0; lVar6 < (material->m_textures).super_ON_ClassArray<ON_Texture>.m_count;
      lVar6 = lVar6 + 1) {
    pOVar1 = (material->m_textures).super_ON_ClassArray<ON_Texture>.m_a;
    if (*(char *)((long)&((ON_Texture *)
                         (&((ON_Texture *)
                           (&((ON_Texture *)(&pOVar1->m_texture_id + -1))->m_texture_id + -1))->
                           m_texture_id + -1))->m_texture_id + lVar5 + 0xfffffffffffffff0U) ==
        '\x01') {
      mapping_channel_id = *(uint *)((long)pOVar1 + lVar5 + -0xc0);
      iVar3 = std::
              _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_ON_TextureMapping>,_std::allocator<std::pair<const_unsigned_int,_ON_TextureMapping>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&mappings->_M_h,&mapping_channel_id);
      if (iVar3.super__Node_iterator_base<std::pair<const_unsigned_int,_ON_TextureMapping>,_false>.
          _M_cur == (__node_type *)0x0) {
        if (mapping_ref == (ON_MappingRef *)0x0) {
          pOVar4 = (ON_MappingChannel *)0x0;
        }
        else {
          pOVar4 = ON_MappingRef::MappingChannel(mapping_ref,mapping_channel_id);
          if (pOVar4 == (ON_MappingChannel *)0x0) {
            pOVar4 = ON_MappingRef::MappingChannel(mapping_ref,1);
          }
        }
        std::function<ON_TextureMapping_(const_ON_MappingChannel_*)>::function(&local_50,local_80);
        ON_Mesh_Private_CacheMappingChannel(&local_50,pOVar4,local_78,mapping_channel_id,mappings);
        std::_Function_base::~_Function_base(&local_50.super__Function_base);
      }
    }
    lVar5 = lVar5 + 0x200;
  }
  if ((mappings->_M_h)._M_element_count == 0) {
    bVar2 = ON_Material::IsPhysicallyBased(material);
    if (bVar2) {
      ON_Material::PhysicallyBased((ON_Material *)&mapping_channel_id);
      dVar7 = (double)(**(code **)(*(long *)CONCAT44(uStack_8c,mapping_channel_id) + 0xb8))();
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_88);
      if (0.0 < dVar7) {
        if (mapping_ref == (ON_MappingRef *)0x0) {
          pOVar4 = (ON_MappingChannel *)0x0;
        }
        else {
          pOVar4 = ON_MappingRef::MappingChannel(mapping_ref,1);
        }
        std::function<ON_TextureMapping_(const_ON_MappingChannel_*)>::function(&local_70,local_80);
        ON_Mesh_Private_CacheMappingChannel(&local_70,pOVar4,local_78,1,mappings);
        std::_Function_base::~_Function_base(&local_70.super__Function_base);
      }
    }
  }
  return true;
}

Assistant:

ON_DECL bool ON_Mesh_Private_AddPerVertexMappingChannels(std::function<ON_TextureMapping(const ON_MappingChannel*)> get_texture_mapping_func, const ON_MappingRef* mapping_ref, const ON_SimpleArray<ON_TextureMapping::TYPE>& mappings_to_cache, const ON_Material& material, std::unordered_map<unsigned int, ON_TextureMapping>& mappings)
{
  for (int i = 0; i < material.m_textures.Count(); i++)
  {
    if (material.m_textures[i].m_bOn)
    {
      // Get mapping channel id and check if mapping already is in the map
      const unsigned int mapping_channel_id = material.m_textures[i].m_mapping_channel_id;
      if (mappings.find(mapping_channel_id) == mappings.end())
      {
        const ON_MappingChannel* mapping_channel = nullptr;
        if (mapping_ref)
        {
          // Get texture mapping and add it to the map
          mapping_channel = mapping_ref->MappingChannel(mapping_channel_id);
          if (mapping_channel == nullptr)
          {
            // If a mapping channel is not found using 'mapping_channel_id', then try with a mapping channel id of 1.
            // This is done according to the documentation for ON_Texture::m_mapping_channel_id.
            mapping_channel = mapping_ref->MappingChannel(1);
          }
        }

        if (!ON_Mesh_Private_CacheMappingChannel(get_texture_mapping_func, mapping_channel, mappings_to_cache, mapping_channel_id, mappings))
          return false;
      }
    }
  }

  // If we didn't cache any texture coordinates above, but we have a material with anisotropy,
  // which requires tangents, which in turn requires texture coordinates, then we cache
  // the texture coordinates from mapping channel 1.
  if (mappings.size() == 0)
  {
    if (material.IsPhysicallyBased() && material.PhysicallyBased()->Anisotropic() > 0.0)
    {
      const ON_MappingChannel* mapping_channel = mapping_ref ? mapping_ref->MappingChannel(1) : nullptr;

      if (!ON_Mesh_Private_CacheMappingChannel(get_texture_mapping_func, mapping_channel, mappings_to_cache, 1, mappings))
        return false;
    }
  }

  return true;
}